

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::DescriptorSet>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::DescriptorSet> *this)

{
  byte bVar1;
  int iVar2;
  VkDescriptorSetAllocateInfo local_70;
  Move<vk::Handle<(vk::HandleType)22>_> local_48;
  
  bVar1 = 0;
  iVar2 = 0;
  do {
    if ((byte)((bVar1 / 5 & 0xfc) * -5) == (char)iVar2) {
      de::SpinBarrier::sync((this->super_ThreadGroupThread).m_barrier);
    }
    local_70.sType = 0x22;
    local_70.pNext = (void *)0x0;
    local_70.descriptorPool.m_internal =
         (this->m_resources->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.
         m_data.object.m_internal;
    local_70.descriptorSetCount = 1;
    local_70.pSetLayouts = (VkDescriptorSetLayout *)&(this->m_resources->descriptorSetLayout).object
    ;
    ::vk::allocateDescriptorSet(&local_48,this->m_env->vkd,this->m_env->device,&local_70);
    if (local_48.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
      local_70._0_8_ =
           local_48.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
      (*(local_48.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_48.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_48.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_48.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal,1,&local_70);
    }
    iVar2 = iVar2 + -1;
    bVar1 = bVar1 + 1;
  } while (iVar2 != -100);
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}